

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryReader::readStrings(WasmBinaryReader *this)

{
  pointer *ppNVar1;
  iterator __position;
  bool bVar2;
  uint32_t uVar3;
  char *in_RCX;
  ulong uVar4;
  Name NVar5;
  string_view s;
  string_view str;
  stringstream local_230 [8];
  stringstream wtf16;
  String local_220 [112];
  ios_base local_1b0 [264];
  string local_a8;
  string local_88;
  string_view local_68;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_58;
  long *local_50;
  IString *local_48;
  long local_40 [2];
  
  uVar3 = getU32LEB(this);
  if (uVar3 != 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"unexpected reserved value in strings","");
    throwError(this,&local_a8);
  }
  uVar3 = getU32LEB(this);
  if (uVar3 != 0) {
    uVar4 = (ulong)uVar3;
    local_58 = &this->strings;
    do {
      NVar5 = getInlineString(this,false);
      str._M_len = NVar5.super_IString.str._M_str;
      std::__cxx11::stringstream::stringstream(local_230);
      str._M_str = in_RCX;
      bVar2 = String::convertWTF8ToWTF16(local_220,NVar5.super_IString.str._M_len,str);
      if (!bVar2) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"invalid string constant","");
        throwError(this,&local_88);
      }
      std::__cxx11::stringbuf::str();
      s._M_str = (char *)0x0;
      s._M_len = (size_t)local_50;
      local_68 = IString::interned(local_48,s,SUB81(in_RCX,0));
      __position._M_current =
           (this->strings).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->strings).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                  (local_58,__position,(Name *)&local_68);
      }
      else {
        ((__position._M_current)->super_IString).str._M_len = local_68._M_len;
        ((__position._M_current)->super_IString).str._M_str = local_68._M_str;
        ppNVar1 = &(this->strings).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppNVar1 = *ppNVar1 + 1;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_230);
      std::ios_base::~ios_base(local_1b0);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void WasmBinaryReader::readStrings() {
  auto reserved = getU32LEB();
  if (reserved != 0) {
    throwError("unexpected reserved value in strings");
  }
  size_t num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto string = getInlineString(false);
    // Re-encode from WTF-8 to WTF-16.
    std::stringstream wtf16;
    if (!String::convertWTF8ToWTF16(wtf16, string.str)) {
      throwError("invalid string constant");
    }
    // TODO: Use wtf16.view() once we have C++20.
    strings.push_back(wtf16.str());
  }
}